

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

void __thiscall SocketInternals::SocketInternals(SocketInternals *this,ostream *ostr)

{
  allocator<char> local_19;
  ostream *local_18;
  ostream *ostr_local;
  SocketInternals *this_local;
  
  this->outStr = ostr;
  this->SocketFD = -1;
  this->InterfaceIndex = 0;
  local_18 = ostr;
  ostr_local = (ostream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->InterfaceName,"undefined",&local_19);
  std::allocator<char>::~allocator(&local_19);
  this->InterfaceMTU = 0x5dc;
  this->FirstRun = true;
  memset(&this->ServerAddr,0,0x10);
  memset(&this->ServerAddrBroadcast,0,0x10);
  memset(&this->ServerAddrMulticast,0,0x10);
  return;
}

Assistant:

SocketInternals::SocketInternals(std::ostream &ostr) : outStr(ostr), SocketFD(INVALID_SOCKET),
                 InterfaceIndex(0), InterfaceName("undefined"), InterfaceMTU(ETH_MTU_DEFAULT), FirstRun(true)
{
    memset(&ServerAddr, 0, sizeof(ServerAddr));
    memset(&ServerAddrBroadcast, 0, sizeof(ServerAddrBroadcast));
    memset(&ServerAddrMulticast, 0, sizeof(ServerAddrMulticast));
}